

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

size_t __thiscall
MADPComponentDiscreteActions::GetNrJointActions(MADPComponentDiscreteActions *this,Scope *agScope)

{
  size_type sVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  MADPComponentDiscreteActions *in_RDI;
  size_t restr_nrJA;
  vector<unsigned_long,_std::allocator<unsigned_long>_> restr_nrAs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  Scope *in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  undefined8 local_8;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  if (sVar1 == 0) {
    local_8 = 0;
  }
  else {
    vec = GetNrActions(in_RDI);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xacdd59);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
               (allocator_type *)in_RDI);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xacdd79);
    IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
    local_8 = VectorTools::VectorProduct<unsigned_long>(vec);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  }
  return local_8;
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrJointActions(const Scope& agScope) const
{
    if(agScope.size()>0)
    {
        const vector<size_t>& nrActions = GetNrActions();
        vector<size_t> restr_nrAs(agScope.size());
        IndexTools::RestrictIndividualIndicesToScope(
            nrActions, agScope, restr_nrAs);
        size_t restr_nrJA = VectorTools::VectorProduct(restr_nrAs);
        return restr_nrJA;
    }
    else
        return(0);
}